

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

bool __thiscall ON_CheckSum::Read(ON_CheckSum *this,ON_BinaryArchive *archive)

{
  uint uVar1;
  int iVar2;
  bool local_19;
  bool rc;
  ON_BinaryArchive *archive_local;
  ON_CheckSum *this_local;
  
  Zero(this);
  local_19 = ON_BinaryArchive::ReadBigSize(archive,&this->m_size);
  if (local_19) {
    local_19 = ON_BinaryArchive::ReadBigTime(archive,&this->m_time);
  }
  if (local_19 != false) {
    local_19 = ON_BinaryArchive::ReadInt(archive,8,this->m_crc);
  }
  uVar1 = ON_BinaryArchive::ArchiveOpenNURBSVersion(archive);
  if ((0xbf4f5db < uVar1) && (iVar2 = ON_BinaryArchive::Archive3dmVersion(archive), 3 < iVar2)) {
    return local_19;
  }
  Zero(this);
  return local_19;
}

Assistant:

bool ON_CheckSum::Read(ON_BinaryArchive& archive)
{
  bool rc;

  Zero();

  rc  = archive.ReadBigSize(&m_size);
  if (rc)
    rc = archive.ReadBigTime(&m_time);
  if (rc)
    rc = archive.ReadInt(8,&m_crc[0]);

  if (    archive.ArchiveOpenNURBSVersion() < 200603100 
       || archive.Archive3dmVersion() < 4 
       )
  {
    // ON_CheckSums in V3 archives and V4 archives with
    // version < 200603100 have the same size but an 
    // incompatible format.  These were not used.
    Zero();
  }

  return rc;
}